

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiEigenSolverImp<double>(void)

{
  Matrix44<double> MStack_88;
  
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_1);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_2);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_3);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_4);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_5);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_6);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_7);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&MStack_88,&A33_8);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_1);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_2);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_3);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_4);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_5);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_6);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_7);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  Imath_3_2::Matrix44<double>::Matrix44(&MStack_88,&A44_8);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&MStack_88);
  return;
}

Assistant:

void
testJacobiEigenSolverImp ()
{
    testJacobiEigenSolver (Matrix33<T> (A33_1));
    testJacobiEigenSolver (Matrix33<T> (A33_2));
    testJacobiEigenSolver (Matrix33<T> (A33_3));
    testJacobiEigenSolver (Matrix33<T> (A33_4));
    testJacobiEigenSolver (Matrix33<T> (A33_5));
    testJacobiEigenSolver (Matrix33<T> (A33_6));
    testJacobiEigenSolver (Matrix33<T> (A33_7));
    testJacobiEigenSolver (Matrix33<T> (A33_8));

    testJacobiEigenSolver (Matrix44<T> (A44_1));
    testJacobiEigenSolver (Matrix44<T> (A44_2));
    testJacobiEigenSolver (Matrix44<T> (A44_3));
    testJacobiEigenSolver (Matrix44<T> (A44_4));
    testJacobiEigenSolver (Matrix44<T> (A44_5));
    testJacobiEigenSolver (Matrix44<T> (A44_6));
    testJacobiEigenSolver (Matrix44<T> (A44_7));
    testJacobiEigenSolver (Matrix44<T> (A44_8));
}